

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O2

void __thiscall
rsg::ExecutionContext::andExecutionMask(ExecutionContext *this,ExecConstValueAccess value)

{
  int i;
  long lVar1;
  bool bVar2;
  ExecConstValueAccess value_00;
  ExecConstValueAccess EVar3;
  ExecMaskStorage tmp;
  
  ExecMaskStorage::ExecMaskStorage(&tmp,true);
  value_00 = (ExecConstValueAccess)ExecMaskStorage::getValue(&tmp);
  EVar3 = getExecutionMask(this);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    if (EVar3.m_value[lVar1].boolVal == true) {
      bVar2 = value.m_value[lVar1].boolVal;
    }
    else {
      bVar2 = false;
    }
    value_00.m_value[lVar1].boolVal = bVar2;
  }
  pushExecutionMask(this,value_00);
  return;
}

Assistant:

void ExecutionContext::andExecutionMask (ExecConstValueAccess value)
{
	ExecMaskStorage			tmp;
	ExecValueAccess			newValue	= tmp.getValue();
	ExecConstValueAccess	oldValue	= getExecutionMask();

	for (int i = 0; i < EXEC_VEC_WIDTH; i++)
		newValue.asBool(i) = oldValue.asBool(i) && value.asBool(i);

	pushExecutionMask(newValue);
}